

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_promise.cpp
# Opt level: O0

void test(void)

{
  undefined1 *this;
  bool bVar1;
  future_error e_3;
  promise<void> p_5;
  future_error e_2;
  promise<int> p_4;
  promise<void> p_3;
  int result;
  int expected_result;
  promise<int> p_2;
  future_error e_1;
  future<void> f_3;
  future<void> f_2;
  promise<void> p_1;
  future_error e;
  undefined1 local_a8 [8];
  future<int> f_1;
  undefined1 local_58 [8];
  future<int> f;
  promise<int> p;
  
  this = &f.variant_.field_0x38;
  std::experimental::v1::promise<int>::promise((promise<int> *)this);
  std::experimental::v1::promise<int>::get_future((future<int> *)local_58,(promise<int> *)this);
  bVar1 = std::experimental::v1::future<int>::valid((future<int> *)local_58);
  if (!bVar1) {
    __assert_fail("f.valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_promise.cpp"
                  ,0xd,"void test()");
  }
  std::experimental::v1::promise<int>::get_future
            ((future<int> *)local_a8,(promise<int> *)&f.variant_.field_0x38);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_promise.cpp"
                ,0x12,"void test()");
}

Assistant:

void test()
{
  {
    // test non-void get_future
    std::experimental::promise<int> p;

    std::experimental::future<int> f = p.get_future();

    assert(f.valid());

    try
    {
      std::experimental::future<int> f = p.get_future();
      assert(0);
    }
    catch(std::future_error e)
    {
      assert(e.code() == std::future_errc::future_already_retrieved);
    }
    catch(...)
    {
      assert(0);
    }
  }

  {
    // test void get_future
    std::experimental::promise<void> p;

    std::experimental::future<void> f = p.get_future();

    assert(f.valid());

    try
    {
      std::experimental::future<void> f = p.get_future();
      assert(0);
    }
    catch(std::future_error e)
    {
      assert(e.code() == std::future_errc::future_already_retrieved);
    }
    catch(...)
    {
      assert(0);
    }
  }

  {
    // test non-void set_value() / .get()
    std::experimental::promise<int> p;

    int expected_result = 13;
    p.set_value(expected_result);

    int result = p.get_future().get();

    assert(expected_result == result);
  }

  {
    // test void set_value() / .get();
    std::experimental::promise<void> p;

    p.set_value();

    p.get_future().get();
  }

  {
    // test non-void superfluous set_value()
    std::experimental::promise<int> p;

    p.set_value(13);

    try
    {
      // calling set_value() again should throw promise_already_satisfied
      p.set_value(13);
      assert(0);
    }
    catch(std::future_error e)
    {
      assert(e.code() == std::future_errc::promise_already_satisfied);
    }
    catch(...)
    {
      assert(0);
    }
  }

  {
    // test void superfluous set_value()
    std::experimental::promise<void> p;

    p.set_value();

    try
    {
      // calling set_value() again should throw promise_already_satisfied
      p.set_value();
      assert(0);
    }
    catch(std::future_error e)
    {
      assert(e.code() == std::future_errc::promise_already_satisfied);
    }
    catch(...)
    {
      assert(0);
    }
  }
}